

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_device.c
# Opt level: O1

int read_devices(s98context *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  s98deviceinfo *psVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  iVar9 = (ctx->header).version;
  if (iVar9 == 2) {
    ctx->devices = (s98deviceinfo *)0x0;
    uVar2 = 0;
    iVar9 = 0;
    do {
      uVar3 = read_dword(ctx);
      uVar4 = read_dword(ctx);
      uVar5 = read_dword(ctx);
      uVar1 = read_dword(ctx);
      if (uVar3 != 0) {
        if (iVar9 <= (int)(uVar2 + 1)) {
          lVar7 = (long)iVar9;
          iVar9 = iVar9 + 4;
          psVar6 = (s98deviceinfo *)realloc(ctx->devices,lVar7 * 0x10 + 0x40);
          ctx->devices = psVar6;
        }
        psVar6 = ctx->devices;
        psVar6[(int)uVar2].device = uVar3;
        psVar6[(int)uVar2].clock = uVar4;
        psVar6[(int)uVar2].panpot = uVar5;
        psVar6[(int)uVar2].reserved = uVar1;
        uVar2 = uVar2 + 1;
      }
    } while (uVar3 != 0);
    if (uVar2 == 0) goto LAB_001017b1;
    psVar6 = (s98deviceinfo *)realloc(ctx->devices,(long)(int)uVar2);
    ctx->devices = psVar6;
    (ctx->header).device_count = uVar2;
  }
  else if (iVar9 == 1) {
    ctx->devices = &default_opna;
    return 0;
  }
  if ((ctx->header).version != 3) {
    return 0;
  }
  uVar8 = (ulong)(ctx->header).device_count;
  if (uVar8 != 0) {
    psVar6 = (s98deviceinfo *)calloc(uVar8,0x10);
    ctx->devices = psVar6;
    if ((ctx->header).device_count == 0) {
      return 0;
    }
    lVar7 = 0xc;
    uVar8 = 0;
    do {
      uVar2 = read_dword(ctx);
      uVar3 = read_dword(ctx);
      uVar4 = read_dword(ctx);
      uVar5 = read_dword(ctx);
      psVar6 = ctx->devices;
      *(uint32_t *)((long)psVar6 + lVar7 + -0xc) = uVar2;
      *(uint32_t *)((long)psVar6 + lVar7 + -8) = uVar3;
      *(uint32_t *)((long)psVar6 + lVar7 + -4) = uVar4;
      *(uint32_t *)((long)&psVar6->device + lVar7) = uVar5;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < (ctx->header).device_count);
    return 0;
  }
LAB_001017b1:
  ctx->devices = &default_opna;
  (ctx->header).device_count = 1;
  return 0;
}

Assistant:

int read_devices(struct s98context* ctx)
{
    if(ctx->header.version == 1) {
        ctx->devices = &default_opna;
        return 0;
    }

    if(ctx->header.version == 2) {
        int devices_allocated = 0;
        int devices = 0;

        ctx->devices = NULL;

        for(;;) {
            struct s98deviceinfo info;
            
            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            if(info.device == s98NONE) break;

            if(devices + 1 >= devices_allocated)  {
                devices_allocated += 4;
                ctx->devices = realloc(ctx->devices, devices_allocated * sizeof(struct s98deviceinfo));
            }
            ctx->devices[devices] = info;
            devices++;
        }
        if(devices == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        } else {
            ctx->devices = realloc(ctx->devices, devices);
            ctx->header.device_count = devices;
        }
    }
    if(ctx->header.version == 3) {
        if(ctx->header.device_count == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        }

        int devices;

        ctx->devices = calloc(ctx->header.device_count, sizeof(struct s98deviceinfo));

        for(devices = 0; devices < ctx->header.device_count; devices++) {
            struct s98deviceinfo info;

            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            ctx->devices[devices] = info;
        }
    }
    return 0;
}